

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O0

void __thiscall
kj::
OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
::destroy(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *this)

{
  bool t;
  bool t_1;
  bool t_2;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  *this_local;
  
  t = destroyVariant<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>(this);
  t_1 = destroyVariant<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>(this);
  t_2 = destroyVariant<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>(this);
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  ::doAll<bool,bool,bool>
            ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              *)this,t,t_1,t_2);
  return;
}

Assistant:

void destroy() {
    doAll(destroyVariant<Variants>()...);
  }